

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_float.h
# Opt level: O0

ostream * spvtools::utils::operator<<
                    (ostream *os,
                    HexFloat<spvtools::utils::FloatProxy<double>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<double>_>_>
                    *value)

{
  _Setfill<char> _Var1;
  fmtflags __fmtfl;
  _Setw _Var2;
  char *pcVar3;
  ulong uVar4;
  ostream *poVar5;
  void *this;
  bool bVar6;
  bool bVar7;
  char local_72;
  uint_type local_70;
  char_type saved_fill;
  long lStack_58;
  fmtflags saved_flags;
  uint_type fraction_nibbles;
  int_type int_exponent;
  bool is_denorm;
  ulong uStack_40;
  bool is_zero;
  uint_type fraction;
  uint_type exponent;
  char *sign;
  uint_type local_20;
  uint_type bits;
  HexFloat<spvtools::utils::FloatProxy<double>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<double>_>_>
  *value_local;
  ostream *os_local;
  
  bits = (uint_type)value;
  value_local = (HexFloat<spvtools::utils::FloatProxy<double>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<double>_>_>
                 *)os;
  sign = (char *)HexFloat<spvtools::utils::FloatProxy<double>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<double>_>_>
                 ::value(value);
  local_20 = FloatProxy<double>::data((FloatProxy<double> *)&sign);
  pcVar3 = "";
  if ((local_20 & 0x8000000000000000) != 0) {
    pcVar3 = "-";
  }
  uVar4 = (local_20 & 0x7ff0000000000000) >> 0x34;
  uStack_40 = local_20 & 0xfffffffffffff;
  bVar6 = uVar4 != 0;
  bVar7 = uStack_40 != 0;
  local_70 = uVar4 - 0x3ff;
  if (!bVar6 && !bVar7) {
    local_70 = 0;
  }
  fraction_nibbles = local_70;
  if (uVar4 == 0 && (bVar6 || bVar7)) {
    for (; (uStack_40 & 0x8000000000000) == 0; uStack_40 = uStack_40 << 1) {
      fraction_nibbles = fraction_nibbles - 1;
    }
    uStack_40 = (uStack_40 & 0x7ffffffffffff) << 1;
  }
  for (lStack_58 = 0xd; lStack_58 != 0 && (uStack_40 & 0xf) == 0; lStack_58 = lStack_58 + -1) {
    uStack_40 = uStack_40 >> 4;
  }
  __fmtfl = std::ios_base::flags
                      ((ios_base *)
                       ((long)&(value_local->value_).data_ +
                       *(long *)((value_local->value_).data_ - 0x18)));
  std::ios::fill();
  poVar5 = std::operator<<((ostream *)value_local,pcVar3);
  poVar5 = std::operator<<(poVar5,"0x");
  local_72 = '0';
  if (bVar6 || bVar7) {
    local_72 = '1';
  }
  std::operator<<(poVar5,local_72);
  if (lStack_58 != 0) {
    poVar5 = std::operator<<((ostream *)value_local,".");
    _Var2 = std::setw((int)lStack_58);
    poVar5 = std::operator<<(poVar5,_Var2);
    _Var1 = std::setfill<char>('0');
    poVar5 = std::operator<<(poVar5,_Var1._M_c);
    this = (void *)std::ostream::operator<<(poVar5,std::hex);
    std::ostream::operator<<(this,uStack_40);
  }
  poVar5 = std::operator<<((ostream *)value_local,"p");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::dec);
  pcVar3 = "";
  if (-1 < (long)fraction_nibbles) {
    pcVar3 = "+";
  }
  poVar5 = std::operator<<(poVar5,pcVar3);
  std::ostream::operator<<(poVar5,fraction_nibbles);
  std::ios_base::flags
            ((ios_base *)
             ((long)&(value_local->value_).data_ + *(long *)((value_local->value_).data_ - 0x18)),
             __fmtfl);
  std::ios::fill((char)value_local + (char)*(undefined8 *)((value_local->value_).data_ - 0x18));
  return (ostream *)value_local;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const HexFloat<T, Traits>& value) {
  using HF = HexFloat<T, Traits>;
  using uint_type = typename HF::uint_type;
  using int_type = typename HF::int_type;

  static_assert(HF::num_used_bits != 0,
                "num_used_bits must be non-zero for a valid float");
  static_assert(HF::num_exponent_bits != 0,
                "num_exponent_bits must be non-zero for a valid float");
  static_assert(HF::num_fraction_bits != 0,
                "num_fractin_bits must be non-zero for a valid float");

  const uint_type bits = value.value().data();
  const char* const sign = (bits & HF::sign_mask) ? "-" : "";
  const uint_type exponent = static_cast<uint_type>(
      (bits & HF::exponent_mask) >> HF::num_fraction_bits);

  uint_type fraction = static_cast<uint_type>((bits & HF::fraction_encode_mask)
                                              << HF::num_overflow_bits);

  const bool is_zero = exponent == 0 && fraction == 0;
  const bool is_denorm = exponent == 0 && !is_zero;

  // exponent contains the biased exponent we have to convert it back into
  // the normal range.
  int_type int_exponent = static_cast<int_type>(exponent - HF::exponent_bias);
  // If the number is all zeros, then we actually have to NOT shift the
  // exponent.
  int_exponent = is_zero ? 0 : int_exponent;

  // If we are denorm, then start shifting, and decreasing the exponent until
  // our leading bit is 1.

  if (is_denorm) {
    while ((fraction & HF::fraction_top_bit) == 0) {
      fraction = static_cast<uint_type>(fraction << 1);
      int_exponent = static_cast<int_type>(int_exponent - 1);
    }
    // Since this is denormalized, we have to consume the leading 1 since it
    // will end up being implicit.
    fraction = static_cast<uint_type>(fraction << 1);  // eat the leading 1
    fraction &= HF::fraction_represent_mask;
  }

  uint_type fraction_nibbles = HF::fraction_nibbles;
  // We do not have to display any trailing 0s, since this represents the
  // fractional part.
  while (fraction_nibbles > 0 && (fraction & 0xF) == 0) {
    // Shift off any trailing values;
    fraction = static_cast<uint_type>(fraction >> 4);
    --fraction_nibbles;
  }

  const auto saved_flags = os.flags();
  const auto saved_fill = os.fill();

  os << sign << "0x" << (is_zero ? '0' : '1');
  if (fraction_nibbles) {
    // Make sure to keep the leading 0s in place, since this is the fractional
    // part.
    os << "." << std::setw(static_cast<int>(fraction_nibbles))
       << std::setfill('0') << std::hex << fraction;
  }
  os << "p" << std::dec << (int_exponent >= 0 ? "+" : "") << int_exponent;

  os.flags(saved_flags);
  os.fill(saved_fill);

  return os;
}